

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crange.h
# Opt level: O2

complex<double> CRange::lngamma<double>(complex<double> *z)

{
  double *pdVar1;
  double dVar2;
  double __x;
  double dVar3;
  undefined8 extraout_RAX;
  long lVar4;
  undefined8 extraout_RDX;
  double dVar5;
  double dVar6;
  double dVar7;
  complex<double> cVar8;
  undefined1 local_a8 [16];
  double local_98;
  double local_90;
  double local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  undefined4 local_68;
  uint uStack_64;
  undefined4 uStack_60;
  uint uStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  double local_40;
  double local_38;
  undefined8 uStack_30;
  double local_20;
  double local_18;
  
  dVar2 = *(double *)z->_M_value;
  local_58 = *(double *)(z->_M_value + 8);
  dVar5 = -dVar2;
  uStack_50 = 0;
  if (dVar2 <= dVar5) {
    local_58 = -local_58;
    uStack_50 = 0x8000000000000000;
  }
  local_88 = (double)(-(ulong)(dVar5 < dVar2) & (ulong)(dVar2 + -1.0) |
                     ~-(ulong)(dVar5 < dVar2) & (ulong)dVar5);
  uStack_80 = 0;
  local_38 = local_88 + 5.5;
  uStack_30 = 0;
  local_78._8_4_ = 0;
  local_78._0_8_ = local_58 * local_58;
  local_78._12_4_ = (int)((ulong)uStack_50 >> 0x20);
  local_18 = SQRT(local_38 * local_38 + local_58 * local_58);
  local_20 = log(local_18);
  local_20 = local_20 * local_58;
  local_40 = atan2(local_58,local_38);
  uStack_64 = local_58._4_4_ ^ 0x80000000;
  uStack_5c = uStack_50._4_4_ ^ 0x80000000;
  local_68 = (undefined4)local_58;
  uStack_60 = (undefined4)uStack_50;
  local_18 = log(local_18);
  dVar2 = atan2(local_58,local_38);
  dVar3 = (double)CONCAT44(uStack_64,local_68);
  dVar5 = 0.0;
  __x = 1.000000000190015;
  lVar4 = 0;
  while (lVar4 != 6) {
    pdVar1 = lngamma<double>::coeff + lVar4;
    lVar4 = lVar4 + 1;
    dVar7 = (double)(int)lVar4 + local_88;
    dVar6 = *pdVar1 / (dVar7 * dVar7 + (double)local_78._0_8_);
    dVar5 = dVar5 + dVar6;
    __x = __x + dVar6 * dVar7;
  }
  local_20 = local_20 + local_40 * (local_88 + 0.5) + dVar3;
  local_58 = (dVar2 * dVar3 - local_38) + 0.9189385332046727 + (local_88 + 0.5) * local_18;
  local_40 = dVar5 * dVar3;
  local_18 = __x;
  local_38 = atan2(local_40,__x);
  dVar2 = log(local_40 * local_40 + local_18 * local_18);
  cVar8._M_value._8_8_ = extraout_RDX;
  cVar8._M_value._0_8_ = extraout_RAX;
  local_38 = local_38 + local_20;
  if (*(double *)z->_M_value < 0.0) {
    local_98 = *(double *)z->_M_value * 3.141592653589793;
    dVar5 = *(double *)(z->_M_value + 8) * 3.141592653589793;
    local_90 = dVar5;
    local_20 = dVar2 * 0.5 + local_58;
    std::sin<double>((complex<double> *)&local_98);
    local_a8._8_8_ = dVar5;
    cVar8 = std::log<double>((complex<double> *)local_a8);
  }
  return (complex<double>)cVar8._M_value;
}

Assistant:

std::complex<T> lngamma( const std::complex<T> &z )
    {
        const static T coeff[6] = {76.18009172947146,
            -86.50532032941677,
            24.01409824083091,
            -1.231739572450155,
            0.1208650973866179e-2,
            -0.5395239384953e-5};
        T x, y;
        if(z.real() > 0) {
            x=z.real()-1.0;
            y=z.imag();
        } else {
            x=-z.real();
            y=-z.imag();
        }
        T r = sqrt((x+5.5)*(x+5.5)+y*y);
        T aterm1=y*log(r);
        T aterm2=(x+0.5)*atan2(y,(x+5.5))-y;
        T lterm1=(x+0.5)*log(r);
        T lterm2=-y*atan2(y,(x+5.5)) - (x+5.5) + 0.5*log(2.0*M_PI);
        T num=0.0;
        T denom=1.000000000190015;
        for(int j=1;j<7;j++){
            T fj=(T)j;
            T cterm=coeff[j-1]/((x+fj)*(x+fj)+y*y);
            num+=cterm;
            denom+=(x+fj)*cterm;
        }
        num*=-y;
        T aterm3=atan2(num,denom);
        T lterm3 = 0.5*log(num*num + denom*denom);
        std::complex<T> result(lterm1+lterm2+lterm3,aterm1+aterm2+aterm3);
        if(z.real() < 0){
            std::complex<T> lpi(log(M_PI), 0.0);
            result = lpi - (result + std::log(std::sin(M_PI*z)));
        }
        return(result);
    }